

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_lpf1_process_pcm_frames
                    (ma_lpf1 *pLPF,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  int iVar2;
  ma_biquad_coefficient *pmVar3;
  ma_result mVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  float fVar9;
  
  mVar4 = MA_INVALID_ARGS;
  if (pFramesIn != (void *)0x0 && (pFramesOut != (void *)0x0 && pLPF != (ma_lpf1 *)0x0)) {
    if (pLPF->format == ma_format_f32) {
      if (frameCount != 0) {
        uVar6 = (ulong)pLPF->channels;
        uVar5 = 0;
        do {
          fVar1 = (pLPF->a).f32;
          uVar7 = 0;
          do {
            pmVar3 = pLPF->pR1;
            fVar9 = *(float *)((long)pFramesIn + uVar7 * 4) * (1.0 - fVar1) +
                    pmVar3[uVar7].f32 * fVar1;
            *(float *)((long)pFramesOut + uVar7 * 4) = fVar9;
            pmVar3[uVar7].f32 = fVar9;
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
          uVar6 = (ulong)pLPF->channels;
          pFramesOut = (void *)((long)pFramesOut + uVar6 * 4);
          pFramesIn = (void *)((long)pFramesIn + uVar6 * 4);
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (uVar5 < frameCount);
      }
    }
    else {
      if (pLPF->format != ma_format_s16) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x82de,
                      "ma_result ma_lpf1_process_pcm_frames(ma_lpf1 *, void *, const void *, ma_uint64)"
                     );
      }
      if (frameCount != 0) {
        uVar6 = (ulong)pLPF->channels;
        uVar5 = 0;
        do {
          iVar2 = (pLPF->a).s32;
          uVar7 = 0;
          do {
            pmVar3 = pLPF->pR1;
            iVar8 = pmVar3[uVar7].s32 * iVar2 +
                    (int)*(short *)((long)pFramesIn + uVar7 * 2) * (0x4000 - iVar2) >> 0xe;
            *(short *)((long)pFramesOut + uVar7 * 2) = (short)iVar8;
            pmVar3[uVar7].s32 = iVar8;
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
          uVar6 = (ulong)pLPF->channels;
          pFramesOut = (void *)((long)pFramesOut + uVar6 * 2);
          pFramesIn = (void *)((long)pFramesIn + uVar6 * 2);
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (uVar5 < frameCount);
      }
    }
    mVar4 = MA_SUCCESS;
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_lpf1_process_pcm_frames(ma_lpf1* pLPF, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_uint32 n;

    if (pLPF == NULL || pFramesOut == NULL || pFramesIn == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Note that the logic below needs to support in-place filtering. That is, it must support the case where pFramesOut and pFramesIn are the same. */

    if (pLPF->format == ma_format_f32) {
        /* */ float* pY = (      float*)pFramesOut;
        const float* pX = (const float*)pFramesIn;

        for (n = 0; n < frameCount; n += 1) {
            ma_lpf1_process_pcm_frame_f32(pLPF, pY, pX);
            pY += pLPF->channels;
            pX += pLPF->channels;
        }
    } else if (pLPF->format == ma_format_s16) {
        /* */ ma_int16* pY = (      ma_int16*)pFramesOut;
        const ma_int16* pX = (const ma_int16*)pFramesIn;

        for (n = 0; n < frameCount; n += 1) {
            ma_lpf1_process_pcm_frame_s16(pLPF, pY, pX);
            pY += pLPF->channels;
            pX += pLPF->channels;
        }
    } else {
        MA_ASSERT(MA_FALSE);
        return MA_INVALID_ARGS; /* Format not supported. Should never hit this because it's checked in ma_biquad_init() and ma_biquad_reinit(). */
    }

    return MA_SUCCESS;
}